

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O0

void mp::
     WriteFlatCon<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *c,ItemNamer *vnam)

{
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  BasicWriter<char> *this;
  char *in_RDX;
  ItemNamer *in_RSI;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *in_RDI;
  BasicMemoryWriter<char,_std::allocator<char>_> *unaff_retaddr;
  BasicStringRef<char> *in_stack_ffffffffffffffc0;
  BasicWriter<char> *in_stack_ffffffffffffffe0;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *algc;
  
  algc = in_RDI;
  BasicConstraint::name((BasicConstraint *)0x1ab136);
  fmt::BasicStringRef<char>::BasicStringRef(in_stack_ffffffffffffffc0,(char *)in_RDI);
  value.size_ = (size_t)in_RSI;
  value.data_ = in_RDX;
  this = fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffe0,value);
  fmt::BasicStringRef<char>::BasicStringRef((BasicStringRef<char> *)this,(char *)in_RDI);
  value_00.size_ = (size_t)in_RSI;
  value_00.data_ = in_RDX;
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffe0,value_00);
  WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::LinTerms,_1>
            (unaff_retaddr,algc,in_RSI);
  return;
}

Assistant:

inline void WriteFlatCon(Writer& wrt, const Con& c,
                  ItemNamer& vnam) {
  wrt << c.name() << ": ";
  WriteModelItem(wrt, c, vnam);
}